

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

base_learner * OjaNewton_setup(options_i *options,vw *all)

{
  vw *pvVar1;
  long *plVar2;
  byte bVar3;
  bool bVar4;
  typed_option<float> *nmemb;
  pointer pOVar5;
  float *pfVar6;
  float **ppfVar7;
  example **ppeVar8;
  pointer pOVar9;
  learner<OjaNewton,_example> *this;
  vw *in_RSI;
  long *in_RDI;
  __type_conflict __x;
  learner<OjaNewton,_example> *l;
  int i;
  option_group_definition new_options;
  string random_init;
  string normalize;
  float alpha_inverse;
  bool oja_newton;
  free_ptr<OjaNewton> ON;
  undefined4 in_stack_fffffffffffff498;
  uint32_t in_stack_fffffffffffff49c;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff4a0;
  string *in_stack_fffffffffffff4a8;
  undefined4 in_stack_fffffffffffff4b0;
  uint32_t in_stack_fffffffffffff4b4;
  _func_void_OjaNewton_ptr *f;
  learner<OjaNewton,_example> *this_00;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff4e8;
  option_group_definition *in_stack_fffffffffffff4f0;
  int local_8c0;
  allocator local_8b9;
  string local_8b8 [32];
  undefined4 local_898;
  allocator local_891;
  string local_890 [39];
  allocator local_869;
  string local_868 [39];
  allocator local_841;
  string local_840 [199];
  allocator local_779;
  string local_778 [39];
  allocator local_751;
  string local_750 [199];
  allocator local_689;
  string local_688 [39];
  allocator local_661;
  string local_660 [199];
  allocator local_599;
  string local_598 [39];
  allocator local_571;
  string local_570 [199];
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [199];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [199];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [199];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  typed_option<bool> local_190;
  allocator local_e9;
  string local_e8 [32];
  undefined1 local_c8 [63];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  float local_30;
  undefined1 local_28 [16];
  vw *local_18;
  long *local_10;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<OjaNewton>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"true",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"true",&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"OjaNewton options",&local_e9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff4a0,
             (string *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"OjaNewton",&local_1b1);
  VW::config::make_option<bool>(in_stack_fffffffffffff4a8,(bool *)in_stack_fffffffffffff4a0);
  VW::config::typed_option<bool>::keep(&local_190,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"Online Newton with Oja\'s Sketch",&local_1d9);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff4a0,
             (string *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff4f0,(typed_option<bool> *)in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"sketch_size",&local_2a1);
  std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
            ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x319a77);
  VW::config::make_option<int>(in_stack_fffffffffffff4a8,(int *)in_stack_fffffffffffff4a0);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0),
             (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"size of sketch",&local_2c9);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffff4a0,
             (string *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            (in_stack_fffffffffffff4f0,(typed_option<int> *)in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"epoch_size",&local_391);
  std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
            ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x319b62);
  VW::config::make_option<int>(in_stack_fffffffffffff4a8,(int *)in_stack_fffffffffffff4a0);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0),
             (int)((ulong)in_stack_fffffffffffff4a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"size of epoch",&local_3b9);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffff4a0,
             (string *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            (in_stack_fffffffffffff4f0,(typed_option<int> *)in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"alpha",&local_481);
  std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
            ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x319c4d);
  VW::config::make_option<float>(in_stack_fffffffffffff4a8,(float *)in_stack_fffffffffffff4a0);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0),
             (float)((ulong)in_stack_fffffffffffff4a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a8,"mutiplicative constant for indentiy",&local_4a9);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff4a0,
             (string *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff4f0,(typed_option<float> *)in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"alpha_inverse",&local_571);
  VW::config::make_option<float>(in_stack_fffffffffffff4a8,(float *)in_stack_fffffffffffff4a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598,"one over alpha, similar to learning rate",&local_599);
  nmemb = VW::config::typed_option<float>::help
                    ((typed_option<float> *)in_stack_fffffffffffff4a0,
                     (string *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff4f0,(typed_option<float> *)in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_660,"learning_rate_cnt",&local_661);
  std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
            ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x319dfe);
  VW::config::make_option<float>(in_stack_fffffffffffff4a8,(float *)in_stack_fffffffffffff4a0);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0),
             (float)((ulong)in_stack_fffffffffffff4a8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_688,"constant for the learning rate 1/t",&local_689);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff4a0,
             (string *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff4f0,(typed_option<float> *)in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_750,"normalize",&local_751);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff4a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_778,"normalize the features or not",&local_779);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffff4a0,
       (string *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_840,"random_init",&local_841);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff4a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_868,"randomize initialization of Oja or not",&local_869);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_fffffffffffff4a0,
       (string *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffff4f0,in_stack_fffffffffffff4e8);
  std::__cxx11::string::~string(local_868);
  std::allocator<char>::~allocator((allocator<char> *)&local_869);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_840);
  std::allocator<char>::~allocator((allocator<char> *)&local_841);
  std::__cxx11::string::~string(local_778);
  std::allocator<char>::~allocator((allocator<char> *)&local_779);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_689);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  std::__cxx11::string::~string(local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  (**(code **)*local_10)(local_10,local_c8);
  plVar2 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_890,"OjaNewton",&local_891);
  bVar3 = (**(code **)(*plVar2 + 8))(plVar2,local_890);
  std::__cxx11::string::~string(local_890);
  std::allocator<char>::~allocator((allocator<char> *)&local_891);
  pvVar1 = local_18;
  if (((bVar3 ^ 0xff) & 1) == 0) {
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31a9ba);
    pOVar5->all = pvVar1;
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff4a0,
                            (char *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31a9ef);
    pOVar5->normalize = bVar4;
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff4a0,
                            (char *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31aa29);
    pOVar5->random_init = bVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8b8,"alpha_inverse",&local_8b9);
    bVar3 = (**(code **)(*local_10 + 8))(local_10,local_8b8);
    std::__cxx11::string::~string(local_8b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
    if ((bVar3 & 1) != 0) {
      pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                         ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31aaef);
      pOVar5->alpha = 1.0 / local_30;
    }
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ab5d);
    pOVar5->cnt = 0;
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ab71);
    pOVar5->t = 1;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ab85);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31abb1);
    pOVar5->ev = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31abca);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31abf6);
    pOVar5->b = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ac0f);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ac3b);
    pOVar5->D = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ac54);
    ppfVar7 = calloc_or_throw<float*>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ac80);
    pOVar5->A = ppfVar7;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ac99);
    ppfVar7 = calloc_or_throw<float*>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31acbd);
    pOVar5->K = ppfVar7;
    for (local_8c0 = 1;
        pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                           ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31acef),
        local_8c0 <= pOVar5->m; local_8c0 = local_8c0 + 1) {
      std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ad0f);
      pfVar6 = calloc_or_throw<float>((size_t)nmemb);
      pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                         ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ad3b);
      pOVar5->A[local_8c0] = pfVar6;
      std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ad60);
      pfVar6 = calloc_or_throw<float>((size_t)nmemb);
      pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                         ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ad84);
      pOVar5->K[local_8c0] = pfVar6;
      pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                         ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ada9);
      pOVar5->A[local_8c0][local_8c0] = 1.0;
      pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                         ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31addb);
      pOVar5->K[local_8c0][local_8c0] = 1.0;
      pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                         ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ae0d);
      pOVar5->D[local_8c0] = 1.0;
    }
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ae49);
    ppeVar8 = calloc_or_throw<example*>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ae71);
    pOVar5->buffer = ppeVar8;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31ae8a);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31aeb2);
    pOVar5->weight_buffer = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31aecb);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31aef7);
    pOVar5->zv = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31af10);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31af39);
    pOVar5->vv = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31af4f);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31af75);
    pOVar5->tmp = pfVar6;
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::get
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)in_stack_fffffffffffff4a0);
    pOVar9 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31af97);
    (pOVar9->data).ON = pOVar5;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31afaa);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31afd0);
    (pOVar5->data).Zx = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31afe6);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31b00c);
    (pOVar5->data).AZx = pfVar6;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31b022);
    pfVar6 = calloc_or_throw<float>((size_t)nmemb);
    f = (_func_void_OjaNewton_ptr *)local_28;
    pOVar5 = std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
                       ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31b048);
    (pOVar5->data).delta = pfVar6;
    this_00 = (learner<OjaNewton,_example> *)&local_18->weights;
    std::unique_ptr<OjaNewton,_void_(*)(void_*)>::operator->
              ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)0x31b071);
    __x = std::log2<int>(0);
    ceil(__x);
    parameters::stride_shift((parameters *)in_stack_fffffffffffff4a0,in_stack_fffffffffffff49c);
    in_stack_fffffffffffff4b4 =
         parameters::stride((parameters *)
                            CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
    this = LEARNER::init_learner<OjaNewton,example,LEARNER::learner<char,char>>
                     ((free_ptr<OjaNewton> *)
                      CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0),
                      (_func_void_OjaNewton_ptr_learner<char,_char>_ptr_example_ptr *)
                      in_stack_fffffffffffff4a8,
                      (_func_void_OjaNewton_ptr_learner<char,_char>_ptr_example_ptr *)
                      in_stack_fffffffffffff4a0,
                      CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498));
    LEARNER::learner<OjaNewton,_example>::set_save_load(this,save_load);
    LEARNER::learner<OjaNewton,_example>::set_finish_example(this,keep_example);
    LEARNER::learner<OjaNewton,_example>::set_finish(this_00,f);
    in_stack_fffffffffffff4a0 =
         (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)LEARNER::make_base<OjaNewton,example>(this);
    local_8 = in_stack_fffffffffffff4a0;
  }
  else {
    local_8 = (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  }
  local_898 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_50);
  std::unique_ptr<OjaNewton,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<OjaNewton,_void_(*)(void_*)> *)
             CONCAT44(in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0));
  return (base_learner *)local_8;
}

Assistant:

base_learner* OjaNewton_setup(options_i& options, vw& all)
{
  auto ON = scoped_calloc_or_throw<OjaNewton>();

  bool oja_newton;
  float alpha_inverse;

  // These two are the only two boolean options that default to true. For now going to do this hack
  // as the infrastructure doesn't easily support this possibility at the same time providing the
  // ease of bool switches elsewhere. It seems that the switch behavior is more critical because
  // of the positional data argument.
  std::string normalize = "true";
  std::string random_init = "true";
  option_group_definition new_options("OjaNewton options");
  new_options.add(make_option("OjaNewton", oja_newton).keep().help("Online Newton with Oja's Sketch"))
      .add(make_option("sketch_size", ON->m).default_value(10).help("size of sketch"))
      .add(make_option("epoch_size", ON->epoch_size).default_value(1).help("size of epoch"))
      .add(make_option("alpha", ON->alpha).default_value(1.f).help("mutiplicative constant for indentiy"))
      .add(make_option("alpha_inverse", alpha_inverse).help("one over alpha, similar to learning rate"))
      .add(make_option("learning_rate_cnt", ON->learning_rate_cnt)
               .default_value(2.f)
               .help("constant for the learning rate 1/t"))
      .add(make_option("normalize", normalize).help("normalize the features or not"))
      .add(make_option("random_init", random_init).help("randomize initialization of Oja or not"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("OjaNewton"))
    return nullptr;

  ON->all = &all;

  ON->normalize = normalize == "true";
  ON->random_init = random_init == "true";

  if (options.was_supplied("alpha_inverse"))
    ON->alpha = 1.f / alpha_inverse;

  ON->cnt = 0;
  ON->t = 1;
  ON->ev = calloc_or_throw<float>(ON->m + 1);
  ON->b = calloc_or_throw<float>(ON->m + 1);
  ON->D = calloc_or_throw<float>(ON->m + 1);
  ON->A = calloc_or_throw<float*>(ON->m + 1);
  ON->K = calloc_or_throw<float*>(ON->m + 1);
  for (int i = 1; i <= ON->m; i++)
  {
    ON->A[i] = calloc_or_throw<float>(ON->m + 1);
    ON->K[i] = calloc_or_throw<float>(ON->m + 1);
    ON->A[i][i] = 1;
    ON->K[i][i] = 1;
    ON->D[i] = 1;
  }

  ON->buffer = calloc_or_throw<example*>(ON->epoch_size);
  ON->weight_buffer = calloc_or_throw<float>(ON->epoch_size);

  ON->zv = calloc_or_throw<float>(ON->m + 1);
  ON->vv = calloc_or_throw<float>(ON->m + 1);
  ON->tmp = calloc_or_throw<float>(ON->m + 1);

  ON->data.ON = ON.get();
  ON->data.Zx = calloc_or_throw<float>(ON->m + 1);
  ON->data.AZx = calloc_or_throw<float>(ON->m + 1);
  ON->data.delta = calloc_or_throw<float>(ON->m + 1);

  all.weights.stride_shift((uint32_t)ceil(log2(ON->m + 2)));

  learner<OjaNewton, example>& l = init_learner(ON, learn, predict, all.weights.stride());
  l.set_save_load(save_load);
  l.set_finish_example(keep_example);
  l.set_finish(finish);
  return make_base(l);
}